

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void __thiscall
KokkosTools::SpaceTimeStack::StackNode::print_recursive
          (StackNode *this,ostream *os,string *my_indent,string *child_indent,double tree_time)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  StackNode *this_00;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  char *pcVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_f8;
  string grandchild_indent;
  set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
  children_by_time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  dVar10 = (this->total_runtime / tree_time) * 100.0;
  if (output_threshold <= dVar10) {
    if ((this->name)._M_string_length != 0) {
      std::operator<<(os,(string *)my_indent);
      dVar1 = this->avg_runtime;
      dVar11 = (this->max_runtime / dVar1 + -1.0) * 100.0;
      lVar3 = *(long *)os;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(os + lVar4 + 0x18) = *(uint *)(os + lVar4 + 0x18) & 0xfffffefb | 0x100;
      *(undefined8 *)(os + *(long *)(lVar3 + -0x18) + 8) = 2;
      poVar6 = std::ostream::_M_insert<double>(dVar1);
      std::operator<<(poVar6," sec ");
      lVar3 = *(long *)os;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(os + lVar4 + 0x18) = *(uint *)(os + lVar4 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(os + *(long *)(lVar3 + -0x18) + 8) = 1;
      dVar1 = this->total_runtime;
      dVar12 = (this->total_kokkos_runtime / dVar1) * 100.0;
      if (this->kind == STACK_REGION) {
        p_Var7 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_f8 = 0.0;
        for (; (_Rb_tree_header *)p_Var7 != &(this->children)._M_t._M_impl.super__Rb_tree_header;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          local_f8 = local_f8 + *(double *)(p_Var7 + 4);
        }
        lVar3 = this->total_number_of_kernel_calls;
        dVar2 = this->avg_runtime;
        poVar6 = std::ostream::_M_insert<double>(dVar10);
        std::operator<<(poVar6,"% ");
        poVar6 = std::ostream::_M_insert<double>(dVar12);
        std::operator<<(poVar6,"% ");
        poVar6 = std::ostream::_M_insert<double>(dVar11);
        std::operator<<(poVar6,"% ");
        poVar6 = std::ostream::_M_insert<double>((1.0 - local_f8 / dVar1) * 100.0);
        poVar6 = std::operator<<(poVar6,"% ");
        lVar4 = *(long *)poVar6;
        lVar5 = *(long *)(lVar4 + -0x18);
        *(uint *)(poVar6 + lVar5 + 0x18) = *(uint *)(poVar6 + lVar5 + 0x18) & 0xfffffefb | 0x100;
        *(undefined8 *)(poVar6 + *(long *)(lVar4 + -0x18) + 8) = 2;
        poVar6 = std::ostream::_M_insert<double>((double)lVar3 / dVar2);
        pcVar9 = " ";
      }
      else {
        poVar6 = std::ostream::_M_insert<double>(dVar10);
        std::operator<<(poVar6,"% ");
        poVar6 = std::ostream::_M_insert<double>(dVar12);
        std::operator<<(poVar6,"% ");
        poVar6 = std::ostream::_M_insert<double>(dVar11);
        poVar6 = std::operator<<(poVar6,"% ");
        pcVar9 = "------ ";
      }
      poVar6 = std::operator<<(poVar6,pcVar9);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      poVar6 = std::operator<<(poVar6," ");
      std::operator<<(poVar6,(string *)&this->name);
      if ((ulong)this->kind < 5) {
        std::operator<<(os,&DAT_0013a820 + *(int *)(&DAT_0013a820 + (ulong)this->kind * 4));
      }
      std::operator<<(os,'\n');
    }
    if ((this->children)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &children_by_time._M_t._M_impl.super__Rb_tree_header._M_header;
      children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      children_by_time._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var8 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(this->children)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        grandchild_indent._M_dataplus._M_p = (pointer)(p_Var8 + 1);
        std::
        _Rb_tree<KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*,std::_Identity<KokkosTools::SpaceTimeStack::StackNode_const*>,KokkosTools::SpaceTimeStack::StackNode::print_recursive(std::ostream&,std::__cxx11::string,std::__cxx11::string_const&,double)const::{lambda(KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*)#1},std::allocator<KokkosTools::SpaceTimeStack::StackNode_const*>>
        ::_M_insert_unique<KokkosTools::SpaceTimeStack::StackNode_const*>
                  ((_Rb_tree<KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*,std::_Identity<KokkosTools::SpaceTimeStack::StackNode_const*>,KokkosTools::SpaceTimeStack::StackNode::print_recursive(std::ostream&,std::__cxx11::string,std::__cxx11::string_const&,double)const::_lambda(KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*)_1_,std::allocator<KokkosTools::SpaceTimeStack::StackNode_const*>>
                    *)&children_by_time,(StackNode **)&grandchild_indent);
      }
      p_Var7 = (_Rb_tree_node_base *)
               std::_Rb_tree_decrement
                         (&children_by_time._M_t._M_impl.super__Rb_tree_header._M_header);
      for (p_Var8 = children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &children_by_time._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        grandchild_indent._M_dataplus._M_p = (pointer)&grandchild_indent.field_2;
        grandchild_indent._M_string_length = 0;
        grandchild_indent.field_2._M_local_buf[0] = '\0';
        if (p_Var8 == p_Var7) {
          std::operator+(&local_50,child_indent,"    ");
        }
        else {
          std::operator+(&local_50,child_indent,"|   ");
        }
        std::__cxx11::string::operator=((string *)&grandchild_indent,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        this_00 = *(StackNode **)(p_Var8 + 1);
        std::operator+(&local_70,child_indent,"|-> ");
        print_recursive(this_00,os,&local_70,&grandchild_indent,tree_time);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&grandchild_indent);
      }
      std::
      _Rb_tree<const_KokkosTools::SpaceTimeStack::StackNode_*,_const_KokkosTools::SpaceTimeStack::StackNode_*,_std::_Identity<const_KokkosTools::SpaceTimeStack::StackNode_*>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:376:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
      ::~_Rb_tree(&children_by_time._M_t);
    }
  }
  return;
}

Assistant:

void print_recursive(std::ostream& os, std::string my_indent,
                       std::string const& child_indent,
                       double tree_time) const {
    auto percent = (total_runtime / tree_time) * 100.0;

    if (percent < output_threshold) return;
    if (!name.empty()) {
      os << my_indent;
      auto imbalance = (max_runtime / avg_runtime - 1.0) * 100.0;
      os << std::scientific << std::setprecision(2);
      os << avg_runtime << " sec ";
      os << std::fixed << std::setprecision(1);
      auto percent_kokkos = (total_kokkos_runtime / total_runtime) * 100.0;

      // Sum over kids if we're a region
      if (kind == STACK_REGION) {
        double child_runtime = 0.0;
        for (auto& child : children) {
          child_runtime += child.total_runtime;
        }
        auto remainder = (1.0 - child_runtime / total_runtime) * 100.0;
        double kps     = total_number_of_kernel_calls / avg_runtime;
        os << percent << "% " << percent_kokkos << "% " << imbalance << "% "
           << remainder << "% " << std::scientific << std::setprecision(2)
           << kps << " " << number_of_calls << " " << name;
      } else
        os << percent << "% " << percent_kokkos << "% " << imbalance << "% "
           << "------ " << number_of_calls << " " << name;

      switch (kind) {
        case STACK_FOR: os << " [for]"; break;
        case STACK_REDUCE: os << " [reduce]"; break;
        case STACK_SCAN: os << " [scan]"; break;
        case STACK_REGION: os << " [region]"; break;
        case STACK_COPY: os << " [copy]"; break;
      };

      os << '\n';
    }
    if (children.empty()) return;
    auto by_time = [](StackNode const* a, StackNode const* b) {
      if (a->total_runtime != b->total_runtime) {
        return a->total_runtime > b->total_runtime;
      }
      return a->name < b->name;
    };
    std::set<StackNode const*, decltype(by_time)> children_by_time(by_time);
    for (auto& child : children) {
      children_by_time.insert(&child);
    }
    auto last = children_by_time.end();
    --last;
    for (auto it = children_by_time.begin(); it != children_by_time.end();
         ++it) {
      std::string grandchild_indent;
      if (it == last) {
        grandchild_indent = child_indent + "    ";
      } else {
        grandchild_indent = child_indent + "|   ";
      }
      auto child = *it;
      child->print_recursive(os, child_indent + "|-> ", grandchild_indent,
                             tree_time);
    }
  }